

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O3

EStatusCode __thiscall
Type1ToType2Converter::Type1RRCurveto(Type1ToType2Converter *this,LongList *inOperandList)

{
  EStatusCode EVar1;
  Trace *this_00;
  
  if ((inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size < 6) {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "Type1ToType2Converter::Type1RRCurveto, rrcurveto expecting 6 arguments, got %d. aborting."
                      ,(inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl.
                       _M_node._M_size);
    EVar1 = eFailure;
  }
  else {
    this->mFirstPathConstructionEncountered = true;
    RecordOperatorWithParameters(this,8,inOperandList);
    EVar1 = eSuccess;
  }
  return EVar1;
}

Assistant:

EStatusCode Type1ToType2Converter::Type1RRCurveto(const LongList& inOperandList)
{
	if(inOperandList.size() < 6) {
		TRACE_LOG1("Type1ToType2Converter::Type1RRCurveto, rrcurveto expecting 6 arguments, got %d. aborting.", inOperandList.size());
		return eFailure;
	}


	mFirstPathConstructionEncountered = true;
	return RecordOperatorWithParameters(8,inOperandList);
}